

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocketaddress_test.cpp
# Opt level: O2

pint p_test_case_psocketaddress_general_test(void)

{
  short sVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  lVar3 = p_socket_address_new("192.168.0.1",0x929);
  if (lVar3 == 0) {
    uVar8 = 0x98;
LAB_00102bd1:
    printf("%s:%d: required check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,uVar8);
    exit(-1);
  }
  iVar2 = p_socket_address_is_loopback(lVar3);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x99);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_is_any(lVar3);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x9a);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_get_family(lVar3);
  if (iVar2 != 2) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x9b);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  sVar1 = p_socket_address_get_port(lVar3);
  if (sVar1 != 0x929) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x9c);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar4 = p_socket_address_get_native_size(lVar3);
  if (lVar4 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x9d);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_get_flow_info(lVar3);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x9e);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_get_scope_id(lVar3);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x9f);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  pcVar5 = (char *)p_socket_address_get_address(lVar3);
  if (pcVar5 == (char *)0x0) {
    uVar8 = 0xa3;
    goto LAB_00102bd1;
  }
  iVar2 = strcmp(pcVar5,"192.168.0.1");
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xa4);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_free(pcVar5);
  p_socket_address_free(lVar3);
  iVar2 = p_socket_address_is_ipv6_supported();
  if (iVar2 != 0) {
    lVar3 = p_socket_address_new("2001:cdba:345f:24ab:fe45:5423:3257:9652",0x929);
    if (lVar3 == 0) {
      uVar8 = 0xad;
      goto LAB_00102bd1;
    }
    iVar2 = p_socket_address_is_loopback(lVar3);
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xae);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_is_any(lVar3);
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xaf);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_get_family(lVar3);
    if (iVar2 != 10) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xb0);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    sVar1 = p_socket_address_get_port(lVar3);
    if (sVar1 != 0x929) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xb1);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    lVar4 = p_socket_address_get_native_size(lVar3);
    if (lVar4 == 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xb2);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_get_flow_info(lVar3);
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xb3);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_get_scope_id(lVar3);
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xb4);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    pcVar5 = (char *)p_socket_address_get_address(lVar3);
    if (pcVar5 == (char *)0x0) {
      uVar8 = 0xb8;
      goto LAB_00102bd1;
    }
    iVar2 = strcmp(pcVar5,"2001:cdba:345f:24ab:fe45:5423:3257:9652");
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xb9);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_free(pcVar5);
    p_socket_address_free(lVar3);
  }
  lVar3 = p_socket_address_new_loopback(2,0x929);
  if (lVar3 == 0) {
    uVar8 = 0xc2;
    goto LAB_00102bd1;
  }
  iVar2 = p_socket_address_is_loopback(lVar3);
  if (iVar2 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xc3);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_is_any(lVar3);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xc4);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_get_family(lVar3);
  if (iVar2 != 2) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xc5);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  sVar1 = p_socket_address_get_port(lVar3);
  if (sVar1 != 0x929) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xc6);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar4 = p_socket_address_get_native_size(lVar3);
  if (lVar4 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,199);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_get_flow_info(lVar3);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,200);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_get_scope_id(lVar3);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xc9);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_address_free(lVar3);
  iVar2 = p_socket_address_is_ipv6_supported();
  if (iVar2 != 0) {
    lVar3 = p_socket_address_new_loopback(10,0x929);
    if (lVar3 == 0) {
      uVar8 = 0xd1;
      goto LAB_00102bd1;
    }
    iVar2 = p_socket_address_is_loopback(lVar3);
    if (iVar2 != 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xd2);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_is_any(lVar3);
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xd3);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_get_family(lVar3);
    if (iVar2 != 10) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xd4);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    sVar1 = p_socket_address_get_port(lVar3);
    if (sVar1 != 0x929) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xd5);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    lVar4 = p_socket_address_get_native_size(lVar3);
    if (lVar4 == 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xd6);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_get_flow_info(lVar3);
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xd7);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_get_scope_id(lVar3);
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0xd8);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_socket_address_free(lVar3);
  }
  lVar3 = p_socket_address_new_any(2,0x929);
  if (lVar3 == 0) {
    uVar8 = 0xe0;
    goto LAB_00102bd1;
  }
  iVar2 = p_socket_address_is_loopback(lVar3);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xe1);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_is_any(lVar3);
  if (iVar2 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xe2);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_get_family(lVar3);
  if (iVar2 != 2) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xe3);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  sVar1 = p_socket_address_get_port(lVar3);
  if (sVar1 != 0x929) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xe4);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar4 = p_socket_address_get_native_size(lVar3);
  if (lVar4 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xe5);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_get_flow_info(lVar3);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xe6);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_get_scope_id(lVar3);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xe7);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar4 = p_socket_address_get_native_size(lVar3);
  p_socket_address_free(lVar3);
  lVar3 = p_malloc0(lVar4);
  if (lVar3 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xef);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar6 = p_socket_address_new_from_native(lVar3,lVar4);
  if (lVar6 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xf0);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar6 = p_socket_address_new("192.168.0.2",0x929);
  if (lVar6 == 0) {
    uVar8 = 0xf2;
    goto LAB_00102bd1;
  }
  p_socket_address_set_flow_info(lVar6,1);
  p_socket_address_set_scope_id(lVar6,1);
  iVar2 = p_socket_address_to_native(lVar6,lVar3,lVar4);
  if (iVar2 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xf7);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_socket_address_free(lVar6);
  lVar6 = p_socket_address_new_from_native(lVar3,lVar4);
  if (lVar6 == 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xfc);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_is_loopback(lVar6);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xfd);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_is_any(lVar6);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xfe);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_get_family(lVar6);
  if (iVar2 != 2) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0xff);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  sVar1 = p_socket_address_get_port(lVar6);
  if (sVar1 != 0x929) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x100);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  lVar7 = p_socket_address_get_native_size(lVar6);
  if (lVar7 != lVar4) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x101);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_get_flow_info(lVar6);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x102);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  iVar2 = p_socket_address_get_scope_id(lVar6);
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x103);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  pcVar5 = (char *)p_socket_address_get_address(lVar6);
  if (pcVar5 == (char *)0x0) {
    uVar8 = 0x107;
    goto LAB_00102bd1;
  }
  iVar2 = strcmp(pcVar5,"192.168.0.2");
  if (iVar2 != 0) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x108);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
  p_free(lVar3);
  p_free(pcVar5);
  p_socket_address_free(lVar6);
  iVar2 = p_socket_address_is_ipv6_supported();
  if (iVar2 != 0) {
    lVar3 = p_socket_address_new_any(10,0x929);
    if (lVar3 == 0) {
      uVar8 = 0x112;
      goto LAB_00102bd1;
    }
    iVar2 = p_socket_address_is_loopback(lVar3);
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x113);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_is_any(lVar3);
    if (iVar2 != 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x114);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_get_family(lVar3);
    if (iVar2 != 10) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x115);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    sVar1 = p_socket_address_get_port(lVar3);
    if (sVar1 != 0x929) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x116);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    lVar4 = p_socket_address_get_native_size(lVar3);
    if (lVar4 == 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x117);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_get_flow_info(lVar3);
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x118);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_get_scope_id(lVar3);
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x119);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    lVar4 = p_socket_address_get_native_size(lVar3);
    p_socket_address_free(lVar3);
    lVar3 = p_malloc0(lVar4);
    if (lVar3 == 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x121);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    lVar6 = p_socket_address_new_from_native(lVar3,lVar4);
    if (lVar6 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x122);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    lVar6 = p_socket_address_new("2001:cdba:345f:24ab:fe45:5423:3257:9652",0x929);
    if (lVar6 == 0) {
      uVar8 = 0x124;
      goto LAB_00102bd1;
    }
    p_socket_address_set_flow_info(lVar6,1);
    p_socket_address_set_scope_id(lVar6,1);
    iVar2 = p_socket_address_to_native(lVar6,lVar3,lVar4);
    if (iVar2 != 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x129);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_socket_address_free(lVar6);
    lVar6 = p_socket_address_new_from_native(lVar3,lVar4);
    if (lVar6 == 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x12e);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_is_loopback(lVar6);
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x12f);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_is_any(lVar6);
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x130);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_get_family(lVar6);
    if (iVar2 != 10) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x131);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    sVar1 = p_socket_address_get_port(lVar6);
    if (sVar1 != 0x929) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x132);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    lVar7 = p_socket_address_get_native_size(lVar6);
    if (lVar7 != lVar4) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x133);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    iVar2 = p_socket_address_is_flow_info_supported();
    if (iVar2 != 0) {
      iVar2 = p_socket_address_get_flow_info(lVar6);
      if (iVar2 != 1) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
               ,0x136);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
    }
    iVar2 = p_socket_address_is_scope_id_supported();
    if (iVar2 != 0) {
      iVar2 = p_socket_address_get_scope_id(lVar6);
      if (iVar2 != 1) {
        printf("%s:%d: check failed\n",
               "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
               ,0x139);
        p_atomic_int_inc(&p_test_module_fail_counter);
      }
    }
    pcVar5 = (char *)p_socket_address_get_address(lVar6);
    if (pcVar5 == (char *)0x0) {
      uVar8 = 0x13d;
      goto LAB_00102bd1;
    }
    iVar2 = strcmp(pcVar5,"2001:cdba:345f:24ab:fe45:5423:3257:9652");
    if (iVar2 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
             ,0x13e);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_free(lVar3);
    p_free(pcVar5);
    p_socket_address_free(lVar6);
  }
  iVar2 = p_socket_address_is_flow_info_supported();
  if (iVar2 == 0) {
    iVar2 = p_socket_address_is_scope_id_supported();
    if (iVar2 == 0) goto LAB_00102aae;
  }
  iVar2 = p_socket_address_is_ipv6_supported();
  if (iVar2 != 1) {
    printf("%s:%d: check failed\n",
           "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/psocketaddress_test.cpp"
           ,0x146);
    p_atomic_int_inc(&p_test_module_fail_counter);
  }
LAB_00102aae:
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (psocketaddress_general_test)
{
	p_libsys_init ();

	/* Test IPv4 LAN address */
	PSocketAddress *addr = p_socket_address_new ("192.168.0.1", 2345);

	P_TEST_REQUIRE (addr != NULL);
	P_TEST_CHECK (p_socket_address_is_loopback (addr) == FALSE);
	P_TEST_CHECK (p_socket_address_is_any (addr) == FALSE);
	P_TEST_CHECK (p_socket_address_get_family (addr) == P_SOCKET_FAMILY_INET);
	P_TEST_CHECK (p_socket_address_get_port (addr) == 2345);
	P_TEST_CHECK (p_socket_address_get_native_size (addr) > 0);
	P_TEST_CHECK (p_socket_address_get_flow_info (addr) == 0);
	P_TEST_CHECK (p_socket_address_get_scope_id (addr) == 0);

	pchar *addr_str = p_socket_address_get_address (addr);

	P_TEST_REQUIRE (addr_str != NULL);
	P_TEST_CHECK (strcmp (addr_str, "192.168.0.1") == 0);

	p_free (addr_str);
	p_socket_address_free (addr);

	if (p_socket_address_is_ipv6_supported ()) {
		/* Test IPv6 LAN address */
		addr = p_socket_address_new ("2001:cdba:345f:24ab:fe45:5423:3257:9652", 2345);

		P_TEST_REQUIRE (addr != NULL);
		P_TEST_CHECK (p_socket_address_is_loopback (addr) == FALSE);
		P_TEST_CHECK (p_socket_address_is_any (addr) == FALSE);
		P_TEST_CHECK (p_socket_address_get_family (addr) == P_SOCKET_FAMILY_INET6);
		P_TEST_CHECK (p_socket_address_get_port (addr) == 2345);
		P_TEST_CHECK (p_socket_address_get_native_size (addr) > 0);
		P_TEST_CHECK (p_socket_address_get_flow_info (addr) == 0);
		P_TEST_CHECK (p_socket_address_get_scope_id (addr) == 0);

		addr_str = p_socket_address_get_address (addr);

		P_TEST_REQUIRE (addr_str != NULL);
		P_TEST_CHECK (strcmp (addr_str, "2001:cdba:345f:24ab:fe45:5423:3257:9652") == 0);

		p_free (addr_str);
		p_socket_address_free (addr);
	}

	/* Test IPv4 loopback address */
	addr = p_socket_address_new_loopback (P_SOCKET_FAMILY_INET, 2345);

	P_TEST_REQUIRE (addr != NULL);
	P_TEST_CHECK (p_socket_address_is_loopback (addr) == TRUE);
	P_TEST_CHECK (p_socket_address_is_any (addr) == FALSE);
	P_TEST_CHECK (p_socket_address_get_family (addr) == P_SOCKET_FAMILY_INET);
	P_TEST_CHECK (p_socket_address_get_port (addr) == 2345);
	P_TEST_CHECK (p_socket_address_get_native_size (addr) > 0);
	P_TEST_CHECK (p_socket_address_get_flow_info (addr) == 0);
	P_TEST_CHECK (p_socket_address_get_scope_id (addr) == 0);

	p_socket_address_free (addr);

	if (p_socket_address_is_ipv6_supported ()) {
		/* Test IPv6 loopback address */
		addr = p_socket_address_new_loopback (P_SOCKET_FAMILY_INET6, 2345);

		P_TEST_REQUIRE (addr != NULL);
		P_TEST_CHECK (p_socket_address_is_loopback (addr) == TRUE);
		P_TEST_CHECK (p_socket_address_is_any (addr) == FALSE);
		P_TEST_CHECK (p_socket_address_get_family (addr) == P_SOCKET_FAMILY_INET6);
		P_TEST_CHECK (p_socket_address_get_port (addr) == 2345);
		P_TEST_CHECK (p_socket_address_get_native_size (addr) > 0);
		P_TEST_CHECK (p_socket_address_get_flow_info (addr) == 0);
		P_TEST_CHECK (p_socket_address_get_scope_id (addr) == 0);

		p_socket_address_free (addr);
	}

	/* Test IPv4 any interface */
	addr = p_socket_address_new_any (P_SOCKET_FAMILY_INET, 2345);

	P_TEST_REQUIRE (addr != NULL);
	P_TEST_CHECK (p_socket_address_is_loopback (addr) == FALSE);
	P_TEST_CHECK (p_socket_address_is_any (addr) == TRUE);
	P_TEST_CHECK (p_socket_address_get_family (addr) == P_SOCKET_FAMILY_INET);
	P_TEST_CHECK (p_socket_address_get_port (addr) == 2345);
	P_TEST_CHECK (p_socket_address_get_native_size (addr) > 0);
	P_TEST_CHECK (p_socket_address_get_flow_info (addr) == 0);
	P_TEST_CHECK (p_socket_address_get_scope_id (addr) == 0);

	psize native_size = p_socket_address_get_native_size (addr);

	p_socket_address_free (addr);

	/* Test IPv4 native raw data */
	ppointer native_buf = p_malloc0 (native_size);
	P_TEST_CHECK (native_buf != NULL);
	P_TEST_CHECK (p_socket_address_new_from_native (native_buf, native_size) == NULL);
	addr = p_socket_address_new ("192.168.0.2", 2345);
	P_TEST_REQUIRE (addr != NULL);

	p_socket_address_set_flow_info (addr, 1);
	p_socket_address_set_scope_id (addr, 1);

	P_TEST_CHECK (p_socket_address_to_native (addr, native_buf, native_size) == TRUE);
	p_socket_address_free (addr);

	addr = p_socket_address_new_from_native (native_buf, native_size);

	P_TEST_CHECK (addr != NULL);
	P_TEST_CHECK (p_socket_address_is_loopback (addr) == FALSE);
	P_TEST_CHECK (p_socket_address_is_any (addr) == FALSE);
	P_TEST_CHECK (p_socket_address_get_family (addr) == P_SOCKET_FAMILY_INET);
	P_TEST_CHECK (p_socket_address_get_port (addr) == 2345);
	P_TEST_CHECK (p_socket_address_get_native_size (addr) == native_size);
	P_TEST_CHECK (p_socket_address_get_flow_info (addr) == 0);
	P_TEST_CHECK (p_socket_address_get_scope_id (addr) == 0);

	addr_str = p_socket_address_get_address (addr);

	P_TEST_REQUIRE (addr_str != NULL);
	P_TEST_CHECK (strcmp (addr_str, "192.168.0.2") == 0);

	p_free (native_buf);
	p_free (addr_str);
	p_socket_address_free (addr);

	if (p_socket_address_is_ipv6_supported ()) {
		/* Test IPv6 any interface */
		addr = p_socket_address_new_any (P_SOCKET_FAMILY_INET6, 2345);

		P_TEST_REQUIRE (addr != NULL);
		P_TEST_CHECK (p_socket_address_is_loopback (addr) == FALSE);
		P_TEST_CHECK (p_socket_address_is_any (addr) == TRUE);
		P_TEST_CHECK (p_socket_address_get_family (addr) == P_SOCKET_FAMILY_INET6);
		P_TEST_CHECK (p_socket_address_get_port (addr) == 2345);
		P_TEST_CHECK (p_socket_address_get_native_size (addr) > 0);
		P_TEST_CHECK (p_socket_address_get_flow_info (addr) == 0);
		P_TEST_CHECK (p_socket_address_get_scope_id (addr) == 0);

		native_size = p_socket_address_get_native_size (addr);

		p_socket_address_free (addr);

		/* Test IPv6 native raw data */
		native_buf = p_malloc0 (native_size);
		P_TEST_CHECK (native_buf != NULL);
		P_TEST_CHECK (p_socket_address_new_from_native (native_buf, native_size) == NULL);
		addr = p_socket_address_new ("2001:cdba:345f:24ab:fe45:5423:3257:9652", 2345);
		P_TEST_REQUIRE (addr != NULL);

		p_socket_address_set_flow_info (addr, 1);
		p_socket_address_set_scope_id (addr, 1);

		P_TEST_CHECK (p_socket_address_to_native (addr, native_buf, native_size) == TRUE);
		p_socket_address_free (addr);

		addr = p_socket_address_new_from_native (native_buf, native_size);

		P_TEST_CHECK (addr != NULL);
		P_TEST_CHECK (p_socket_address_is_loopback (addr) == FALSE);
		P_TEST_CHECK (p_socket_address_is_any (addr) == FALSE);
		P_TEST_CHECK (p_socket_address_get_family (addr) == P_SOCKET_FAMILY_INET6);
		P_TEST_CHECK (p_socket_address_get_port (addr) == 2345);
		P_TEST_CHECK (p_socket_address_get_native_size (addr) == native_size);

		if (p_socket_address_is_flow_info_supported ())
			P_TEST_CHECK (p_socket_address_get_flow_info (addr) == 1);

		if (p_socket_address_is_scope_id_supported ())
			P_TEST_CHECK (p_socket_address_get_scope_id (addr) == 1);

		addr_str = p_socket_address_get_address (addr);

		P_TEST_REQUIRE (addr_str != NULL);
		P_TEST_CHECK (strcmp (addr_str, "2001:cdba:345f:24ab:fe45:5423:3257:9652") == 0);

		p_free (native_buf);
		p_free (addr_str);
		p_socket_address_free (addr);
	}

	if (p_socket_address_is_flow_info_supported () || p_socket_address_is_scope_id_supported ())
		P_TEST_CHECK (p_socket_address_is_ipv6_supported () == TRUE);

	p_libsys_shutdown ();
}